

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToJUnit.cpp
# Opt level: O2

void __thiscall
ResultToJUnitHandler::testCaseResultComplete
          (ResultToJUnitHandler *this,TestCaseResultPtr *resultData)

{
  Writer *pWVar1;
  char *value_;
  Attribute local_160;
  Attribute local_120;
  BeginElement local_e0;
  string groupName;
  string caseName;
  TestCaseResult result;
  
  xe::TestCaseResult::TestCaseResult(&result);
  xe::parseTestCaseResultFromData(&this->m_resultParser,&result,resultData->m_ptr);
  std::__cxx11::string::rfind((char)&result,0x2e);
  std::__cxx11::string::substr((ulong)&caseName,(ulong)&result);
  std::__cxx11::string::substr((ulong)&groupName,(ulong)&result);
  pWVar1 = this->m_writer;
  xe::xml::Writer::BeginElement::BeginElement(&local_e0,"testcase");
  pWVar1 = xe::xml::Writer::operator<<(pWVar1,&local_e0);
  xe::xml::Writer::Attribute::Attribute(&local_120,"name",&caseName);
  pWVar1 = xe::xml::Writer::operator<<(pWVar1,&local_120);
  xe::xml::Writer::Attribute::Attribute(&local_160,"classname",&groupName);
  xe::xml::Writer::operator<<(pWVar1,&local_160);
  xe::xml::Writer::Attribute::~Attribute(&local_160);
  xe::xml::Writer::Attribute::~Attribute(&local_120);
  std::__cxx11::string::~string((string *)&local_e0);
  if (result.super_TestCaseResultHeader.statusCode != TESTSTATUSCODE_PASS) {
    pWVar1 = this->m_writer;
    xe::xml::Writer::BeginElement::BeginElement((BeginElement *)&local_160,"failure");
    pWVar1 = xe::xml::Writer::operator<<(pWVar1,(BeginElement *)&local_160);
    value_ = xe::getTestStatusCodeName(result.super_TestCaseResultHeader.statusCode);
    xe::xml::Writer::Attribute::Attribute(&local_120,"type",value_);
    pWVar1 = xe::xml::Writer::operator<<(pWVar1,&local_120);
    pWVar1 = xe::xml::Writer::operator<<(pWVar1,&result.super_TestCaseResultHeader.statusDetails);
    xe::xml::Writer::operator<<(pWVar1,(EndElementType *)&xe::xml::Writer::EndElement);
    xe::xml::Writer::Attribute::~Attribute(&local_120);
    std::__cxx11::string::~string((string *)&local_160);
  }
  xe::xml::Writer::operator<<(this->m_writer,(EndElementType *)&xe::xml::Writer::EndElement);
  std::__cxx11::string::~string((string *)&groupName);
  std::__cxx11::string::~string((string *)&caseName);
  xe::TestCaseResult::~TestCaseResult(&result);
  return;
}

Assistant:

void testCaseResultComplete (const xe::TestCaseResultPtr& resultData)
	{
		using xe::xml::Writer;

		xe::TestCaseResult result;

		xe::parseTestCaseResultFromData(&m_resultParser, &result, *resultData.get());

		// Split group and case names.
		size_t			sepPos		= result.casePath.find_last_of('.');
		std::string		caseName	= result.casePath.substr(sepPos+1);
		std::string		groupName	= result.casePath.substr(0, sepPos);

		// Write result.
		m_writer << Writer::BeginElement("testcase")
				 << Writer::Attribute("name", caseName)
				 << Writer::Attribute("classname", groupName);

		if (result.statusCode != xe::TESTSTATUSCODE_PASS)
			m_writer << Writer::BeginElement("failure")
					 << Writer::Attribute("type", xe::getTestStatusCodeName(result.statusCode))
					 << result.statusDetails
					 << Writer::EndElement;

		m_writer << Writer::EndElement;
	}